

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::TreeEnsembleClassifier
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  void *pvVar1;
  TreeEnsembleParameters *from_00;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  StringVector *from_01;
  Int64Vector *from_02;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleClassifier_003dbc78;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->treeensemble_;
  if (from_00 == (TreeEnsembleParameters *)0x0 ||
      from == (TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_) {
    this_00 = (TreeEnsembleParameters *)0x0;
  }
  else {
    this_00 = (TreeEnsembleParameters *)operator_new(0x50);
    TreeEnsembleParameters::TreeEnsembleParameters(this_00,from_00);
  }
  this->treeensemble_ = this_00;
  this->postevaluationtransform_ = from->postevaluationtransform_;
  this->_oneof_case_[0] = 0;
  if (from->_oneof_case_[0] == 0x65) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    this_02 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_02);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[0] == 0x65) {
      from_02 = (from->ClassLabels_).int64classlabels_;
    }
    else {
      from_02 = Int64Vector::default_instance();
    }
    Int64Vector::MergeFrom(this_02,from_02);
  }
  else if (from->_oneof_case_[0] == 100) {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 100;
    this_01 = (StringVector *)operator_new(0x30);
    StringVector::StringVector(this_01);
    (this->ClassLabels_).stringclasslabels_ = this_01;
    if (from->_oneof_case_[0] == 100) {
      from_01 = (from->ClassLabels_).stringclasslabels_;
    }
    else {
      from_01 = StringVector::default_instance();
    }
    StringVector::MergeFrom(this_01,from_01);
  }
  return;
}

Assistant:

TreeEnsembleClassifier::TreeEnsembleClassifier(const TreeEnsembleClassifier& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_treeensemble()) {
    treeensemble_ = new ::CoreML::Specification::TreeEnsembleParameters(*from.treeensemble_);
  } else {
    treeensemble_ = NULL;
  }
  postevaluationtransform_ = from.postevaluationtransform_;
  clear_has_ClassLabels();
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleClassifier)
}